

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O2

string * __thiscall
pybind11::detail::replace_newlines_and_squash_abi_cxx11_
          (string *__return_storage_ptr__,detail *this,char *text)

{
  bool bVar1;
  void *pvVar2;
  long lVar3;
  allocator<char> local_59;
  string *local_58;
  string result;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&result,(char *)this,&local_59);
  if (((result._M_string_length < 2) || (*result._M_dataplus._M_p != '\'')) ||
     (result._M_dataplus._M_p[result._M_string_length - 1] != '\'')) {
    result._M_string_length = 0;
    *result._M_dataplus._M_p = '\0';
    bVar1 = false;
    local_58 = __return_storage_ptr__;
    for (; *this != (detail)0x0; this = this + 1) {
      pvVar2 = memchr(" \t\n\r\f\v",(int)(char)*this,7);
      if (!(bool)(pvVar2 != (void *)0x0 & bVar1)) {
        std::__cxx11::string::push_back((char)&result);
      }
      bVar1 = pvVar2 != (void *)0x0;
    }
    lVar3 = std::__cxx11::string::find_first_not_of((char *)&result,0x153256);
    __return_storage_ptr__ = local_58;
    if (lVar3 == -1) {
      std::__cxx11::string::string<std::allocator<char>>((string *)local_58,"",&local_59);
    }
    else {
      std::__cxx11::string::find_last_not_of((char *)&result,0x153256);
      __return_storage_ptr__ = local_58;
      std::__cxx11::string::substr((ulong)local_58,(ulong)&result);
    }
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)result._M_dataplus._M_p == &result.field_2) {
      (__return_storage_ptr__->field_2)._M_allocated_capacity =
           CONCAT71(result.field_2._M_allocated_capacity._1_7_,result.field_2._M_local_buf[0]);
      *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = result.field_2._8_8_;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = result._M_dataplus._M_p;
      (__return_storage_ptr__->field_2)._M_allocated_capacity =
           CONCAT71(result.field_2._M_allocated_capacity._1_7_,result.field_2._M_local_buf[0]);
    }
    __return_storage_ptr__->_M_string_length = result._M_string_length;
    result._M_string_length = 0;
    result.field_2._M_local_buf[0] = '\0';
    result._M_dataplus._M_p = (pointer)&result.field_2;
  }
  std::__cxx11::string::~string((string *)&result);
  return __return_storage_ptr__;
}

Assistant:

inline std::string replace_newlines_and_squash(const char *text) {
    const char *whitespaces = " \t\n\r\f\v";
    std::string result(text);
    bool previous_is_whitespace = false;

    if (result.size() >= 2) {
        // Do not modify string representations
        char first_char = result[0];
        char last_char = result[result.size() - 1];
        if (first_char == last_char && first_char == '\'') {
            return result;
        }
    }
    result.clear();

    // Replace characters in whitespaces array with spaces and squash consecutive spaces
    while (*text != '\0') {
        if (std::strchr(whitespaces, *text)) {
            if (!previous_is_whitespace) {
                result += ' ';
                previous_is_whitespace = true;
            }
        } else {
            result += *text;
            previous_is_whitespace = false;
        }
        ++text;
    }

    // Strip leading and trailing whitespaces
    const size_t str_begin = result.find_first_not_of(whitespaces);
    if (str_begin == std::string::npos) {
        return "";
    }

    const size_t str_end = result.find_last_not_of(whitespaces);
    const size_t str_range = str_end - str_begin + 1;

    return result.substr(str_begin, str_range);
}